

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

void __thiscall
kratos::AssertPropertyStmt::AssertPropertyStmt
          (AssertPropertyStmt *this,shared_ptr<kratos::Property> *property)

{
  AssertBase::AssertBase(&this->super_AssertBase);
  (this->super_AssertBase).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0057c890
  ;
  this->property_ =
       (property->super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

AssertPropertyStmt::AssertPropertyStmt(const std::shared_ptr<Property> &property)
    : property_(property.get()) {}